

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalNotOperator(Evaluator *this,GCPtr<symbols::Object> *rightExpr)

{
  _List_node_base *p_Var1;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar2;
  GCPtr<symbols::Object> GVar3;
  
  p_Var1 = (_List_node_base *)rightExpr->addr;
  GVar3.addr = NATIVE_FALSE.addr;
  if (p_Var1 == (_List_node_base *)NATIVE_TRUE.addr) {
    plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               ((_List_node_base *)plVar2)->_M_next;
      if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != (_List_node_base *)NATIVE_FALSE.addr
            );
  }
  else if (p_Var1 == (_List_node_base *)NATIVE_FALSE.addr) {
    plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               ((_List_node_base *)plVar2)->_M_next;
      GVar3.addr = NATIVE_TRUE.addr;
      if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != (_List_node_base *)NATIVE_TRUE.addr)
    ;
  }
  else if (p_Var1 == (_List_node_base *)NATIVE_NULL.addr) {
    plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               ((_List_node_base *)plVar2)->_M_next;
      GVar3.addr = NATIVE_NULL.addr;
      if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != p_Var1);
  }
  else {
    plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar2->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != (_List_node_base *)NATIVE_FALSE.addr
            );
  }
  *(int *)((long)plVar2 + 0x10U) = *(int *)((long)plVar2 + 0x10U) + 1;
  *(Object **)this = GVar3.addr;
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalNotOperator(GCPtr<Object> rightExpr){
    if(rightExpr == NATIVE_TRUE){
        return NATIVE_FALSE;
    }else if(rightExpr == NATIVE_FALSE){
        return NATIVE_TRUE;
    }else if(rightExpr == NATIVE_NULL){
       return NATIVE_NULL;
    }
    return NATIVE_FALSE;
}